

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O1

void __thiscall NaNNUnit::SetInputScale(NaNNUnit *this,NaReal *yMin,NaReal *yMax)

{
  NaReal NVar1;
  uint uVar2;
  NaReal *pNVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((yMin != (NaReal *)0x0) && (yMax != (NaReal *)0x0)) {
    if ((this->descr).nInputsRepeat != 0) {
      uVar6 = 0;
      do {
        uVar2 = (this->descr).nInputsNumber;
        uVar7 = (ulong)uVar2;
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            NVar1 = yMin[uVar5];
            pNVar3 = NaVector::operator[](&(this->InputScaler).min,(int)uVar7 * uVar6 + (int)uVar5);
            *pNVar3 = NVar1;
            NVar1 = yMax[uVar5];
            pNVar3 = NaVector::operator[]
                               (&(this->InputScaler).max,
                                (this->descr).nInputsNumber * uVar6 + (int)uVar5);
            *pNVar3 = NVar1;
            uVar5 = uVar5 + 1;
            uVar7 = (ulong)(this->descr).nInputsNumber;
          } while (uVar5 < uVar7);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->descr).nInputsRepeat);
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::SetInputScale (const NaReal* yMin, const NaReal* yMax)
{
    if(NULL == yMin || NULL == yMax)
        throw(na_null_pointer);

    unsigned    i, j;
    for(i = 0; i < descr.nInputsRepeat; ++i){
        for(j = 0; j < descr.nInputsNumber; ++j){
            InputScaler.min[i * descr.nInputsNumber + j] = yMin[j];
            InputScaler.max[i * descr.nInputsNumber + j] = yMax[j];
        }
    }
}